

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::CharSetLeaf::IsEqualTo(CharSetLeaf *this,uint level,CharSetNode *other)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  
  if (level != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x32f,"(level == 0)","level == 0");
    if (!bVar2) goto LAB_00cd8bf5;
    *puVar4 = 0;
  }
  if (other == (CharSetNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x330,"(other != nullptr)","other != nullptr");
    if (!bVar2) goto LAB_00cd8bf5;
    *puVar4 = 0;
  }
  else if (other == (CharSetNode *)&CharSetFull::Instance) {
    return false;
  }
  iVar3 = (*other->_vptr_CharSetNode[0xd])(other);
  if ((char)iVar3 == '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x333,"(other->IsLeaf())","other->IsLeaf()");
    if (!bVar2) {
LAB_00cd8bf5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = CharBitvec::IsSubsetOf(&this->vec,(CharBitvec *)(other + 1));
  return bVar2;
}

Assistant:

bool CharSetLeaf::IsEqualTo(uint level, const CharSetNode* other) const
    {
        Assert(level == 0);
        Assert(other != nullptr);
        if (other == CharSetFull::TheFullNode)
            return false;
        Assert(other->IsLeaf());
        CharSetLeaf* otherLeaf = (CharSetLeaf*)other;
        return vec.IsSubsetOf(otherLeaf->vec);
    }